

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O3

void __thiscall DSFrame::~DSFrame(DSFrame *this)

{
  VSFrameRef *pVVar1;
  VSFrameRef *pVVar2;
  
  if (this->SrcPointers != (uchar **)0x0) {
    operator_delete__(this->SrcPointers);
  }
  if (this->DstPointers != (uchar **)0x0) {
    operator_delete__(this->DstPointers);
  }
  if (this->StrideBytes != (int *)0x0) {
    operator_delete__(this->StrideBytes);
  }
  pVVar2 = this->_vssrc;
  pVVar1 = this->_vsdst;
  if (pVVar1 != pVVar2 && pVVar1 != (VSFrameRef *)0x0) {
    (*this->_vsapi->freeFrame)(pVVar1);
    pVVar2 = this->_vssrc;
  }
  if (pVVar2 != (VSFrameRef *)0x0) {
    (*this->_vsapi->freeFrame)(pVVar2);
  }
  PVideoFrame::~PVideoFrame(&this->_avssrc);
  return;
}

Assistant:

~DSFrame()
  {
    if (SrcPointers)
      delete[] SrcPointers;
    if (DstPointers)
      delete[] DstPointers;
    if (StrideBytes)
      delete[] StrideBytes;
    if (_vsdst && _vsdst != _vssrc)
      _vsapi->freeFrame(_vsdst);
    if (_vssrc)
      _vsapi->freeFrame(_vssrc);
  }